

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Own<const_kj::WritableFileMapping> __thiscall
kj::anon_unknown_35::InMemoryFile::mmapWritable(InMemoryFile *this,uint64_t offset,uint64_t size)

{
  Impl *pIVar1;
  long in_RCX;
  WritableFileMapping *extraout_RDX;
  Own<const_kj::WritableFileMapping> OVar2;
  ArrayPtr<unsigned_char> local_88;
  Own<const_kj::(anonymous_namespace)::InMemoryFile> local_78;
  Own<kj::(anonymous_namespace)::InMemoryFile::WritableFileMappingImpl> local_68;
  undefined1 local_58 [8];
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  Fault local_38;
  Fault f;
  uint64_t end;
  uint64_t size_local;
  uint64_t offset_local;
  InMemoryFile *this_local;
  
  f.exception = (Exception *)(size + in_RCX);
  if (size <= f.exception) {
    MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_58);
    pIVar1 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_58);
    Impl::ensureCapacity(pIVar1,(size_t)f.exception);
    atomicAddRef<kj::(anonymous_namespace)::InMemoryFile>((kj *)&local_78,(InMemoryFile *)offset);
    pIVar1 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_58);
    local_88 = Array<unsigned_char>::slice(&pIVar1->bytes,size,(size_t)f.exception);
    heap<kj::(anonymous_namespace)::InMemoryFile::WritableFileMappingImpl,kj::Own<kj::(anonymous_namespace)::InMemoryFile_const>,kj::ArrayPtr<unsigned_char>>
              ((kj *)&local_68,&local_78,&local_88);
    Own<kj::WritableFileMapping_const>::
    Own<kj::(anonymous_namespace)::InMemoryFile::WritableFileMappingImpl,void>
              ((Own<kj::WritableFileMapping_const> *)this,&local_68);
    Own<kj::(anonymous_namespace)::InMemoryFile::WritableFileMappingImpl>::~Own(&local_68);
    Own<const_kj::(anonymous_namespace)::InMemoryFile>::~Own(&local_78);
    Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
              ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_58);
    OVar2.ptr = extraout_RDX;
    OVar2.disposer = (Disposer *)this;
    return OVar2;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
            (&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x366,FAILED,"end >= offset","\"mmapWritable() request overflows uint64\"",
             (char (*) [40])"mmapWritable() request overflows uint64");
  kj::_::Debug::Fault::fatal(&local_38);
}

Assistant:

Own<const WritableFileMapping> mmapWritable(uint64_t offset, uint64_t size) const override {
    uint64_t end = offset + size;
    KJ_REQUIRE(end >= offset, "mmapWritable() request overflows uint64");
    auto lock = impl.lockExclusive();
    lock->ensureCapacity(end);
    return heap<WritableFileMappingImpl>(atomicAddRef(*this), lock->bytes.slice(offset, end));
  }